

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_12a4996::TGlslangToSpvTraverser::visitLoop
          (TGlslangToSpvTraverser *this,TVisit param_1,TIntermLoop *node)

{
  Builder *this_00;
  uint uVar1;
  Block *pBVar2;
  TIntermNode *pTVar3;
  TIntermTyped *pTVar4;
  int iVar5;
  int iVar6;
  Id IVar7;
  LoopBlocks *pLVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Block *pBVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  char *pcVar10;
  uint control;
  vector<unsigned_int,_std::allocator<unsigned_int>_> operands;
  uint local_6c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  Block *local_48;
  Block *local_40;
  Block *local_38;
  
  this_00 = &this->builder;
  pLVar8 = spv::Builder::makeNewLoop(this_00);
  pBVar9 = pLVar8->head;
  pBVar2 = pLVar8->body;
  local_48 = pLVar8->merge;
  local_40 = pLVar8->continue_target;
  spv::Builder::createBranch(this_00,true,pBVar9);
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  control = (uint)node->unroll + (uint)node->dontUnroll * 2;
  uVar1 = node->dependency;
  if (uVar1 == 0xffffffff) {
    control = control | 4;
  }
  else if (0 < (int)uVar1) {
    control = control | 8;
    local_6c = uVar1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_68,(iterator)0x0,&local_6c);
  }
  if (0x103ff < (this->glslangIntermediate->spvVersion).spv) {
    uVar1 = node->minIterations;
    if (uVar1 != 0) {
      local_6c = uVar1;
      if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_68,
                   (iterator)
                   local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_6c);
      }
      else {
        *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar1;
        local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      control = control | 0x10;
    }
    uVar1 = node->maxIterations;
    if (uVar1 != 0xffffffff) {
      local_6c = uVar1;
      if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_68,
                   (iterator)
                   local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_6c);
      }
      else {
        *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar1;
        local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      control = control | 0x20;
    }
    uVar1 = node->iterationMultiple;
    if (1 < uVar1) {
      local_6c = uVar1;
      if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_68,
                   (iterator)
                   local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_6c);
      }
      else {
        *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar1;
        local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      control = control | 0x40;
    }
    uVar1 = node->peelCount;
    if (uVar1 != 0) {
      local_6c = uVar1;
      if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_68,
                   (iterator)
                   local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_6c);
      }
      else {
        *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar1;
        local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      control = control | 0x80;
    }
    uVar1 = node->partialCount;
    if (uVar1 != 0) {
      local_6c = uVar1;
      if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_68,
                   (iterator)
                   local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_6c);
      }
      else {
        *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar1;
        local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      control = control | 0x100;
    }
  }
  (this->builder).buildPoint = pBVar9;
  (this->builder).dirtyLineTracker = true;
  (this->builder).dirtyScopeTracker = true;
  local_38 = pBVar9;
  iVar5 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
  iVar5 = *(int *)(CONCAT44(extraout_var,iVar5) + 0xc);
  iVar6 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
  if (*(long *)CONCAT44(extraout_var_00,iVar6) == 0) {
    pcVar10 = (char *)0x0;
  }
  else {
    pcVar10 = *(char **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 8);
  }
  spv::Builder::setDebugSourceLocation(this_00,iVar5,pcVar10);
  spv::Builder::createLoopMerge(this_00,local_48,local_40,control,&local_68);
  if ((node->first == true) && (node->test != (TIntermTyped *)0x0)) {
    pBVar9 = spv::Builder::makeNewBlock(this_00);
    spv::Builder::createBranch(this_00,true,pBVar9);
    (this->builder).buildPoint = pBVar9;
    (this->builder).dirtyLineTracker = true;
    (this->builder).dirtyScopeTracker = true;
    (*(node->test->super_TIntermNode)._vptr_TIntermNode[2])(node->test,this);
    iVar5 = (*(node->test->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    IVar7 = accessChainLoad(this,(TType *)CONCAT44(extraout_var_01,iVar5));
    spv::Builder::createConditionalBranch(this_00,IVar7,pBVar2,local_48);
    (this->builder).buildPoint = pBVar2;
    (this->builder).dirtyLineTracker = true;
    (this->builder).dirtyScopeTracker = true;
    local_6c = CONCAT31(local_6c._1_3_,1);
    std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
              (&(this->breakForLoop).c,(bool *)&local_6c);
    pTVar3 = node->body;
    if (pTVar3 != (TIntermNode *)0x0) {
      (*pTVar3->_vptr_TIntermNode[2])(pTVar3,this);
    }
    pBVar9 = local_40;
    spv::Builder::createBranch(this_00,true,local_40);
    std::deque<bool,_std::allocator<bool>_>::pop_back(&(this->breakForLoop).c);
    (this->builder).buildPoint = pBVar9;
    (this->builder).dirtyLineTracker = true;
    (this->builder).dirtyScopeTracker = true;
    pTVar4 = node->terminal;
    if (pTVar4 != (TIntermTyped *)0x0) {
      (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[2])(pTVar4,this);
    }
    spv::Builder::createBranch(this_00,true,local_38);
    pBVar9 = local_48;
  }
  else {
    iVar5 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
    iVar5 = *(int *)(CONCAT44(extraout_var_02,iVar5) + 0xc);
    iVar6 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
    if (*(long *)CONCAT44(extraout_var_03,iVar6) == 0) {
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar10 = *(char **)(*(long *)CONCAT44(extraout_var_03,iVar6) + 8);
    }
    spv::Builder::setDebugSourceLocation(this_00,iVar5,pcVar10);
    spv::Builder::createBranch(this_00,true,pBVar2);
    local_6c = CONCAT31(local_6c._1_3_,1);
    std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
              (&(this->breakForLoop).c,(bool *)&local_6c);
    (this->builder).buildPoint = pBVar2;
    (this->builder).dirtyLineTracker = true;
    (this->builder).dirtyScopeTracker = true;
    pTVar3 = node->body;
    if (pTVar3 != (TIntermNode *)0x0) {
      (*pTVar3->_vptr_TIntermNode[2])(pTVar3,this);
    }
    pBVar9 = local_40;
    spv::Builder::createBranch(this_00,true,local_40);
    std::deque<bool,_std::allocator<bool>_>::pop_back(&(this->breakForLoop).c);
    (this->builder).buildPoint = pBVar9;
    (this->builder).dirtyLineTracker = true;
    (this->builder).dirtyScopeTracker = true;
    pTVar4 = node->terminal;
    if (pTVar4 != (TIntermTyped *)0x0) {
      (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[2])(pTVar4,this);
    }
    pBVar2 = local_38;
    pBVar9 = local_48;
    pTVar4 = node->test;
    if (pTVar4 == (TIntermTyped *)0x0) {
      spv::Builder::createBranch(this_00,true,local_38);
    }
    else {
      (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[2])(pTVar4,this);
      iVar5 = (*(node->test->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      IVar7 = accessChainLoad(this,(TType *)CONCAT44(extraout_var_04,iVar5));
      spv::Builder::createConditionalBranch(this_00,IVar7,pBVar2,pBVar9);
    }
  }
  (this->builder).buildPoint = pBVar9;
  (this->builder).dirtyLineTracker = true;
  (this->builder).dirtyScopeTracker = true;
  spv::Builder::closeLoop(this_00);
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return false;
}

Assistant:

bool TGlslangToSpvTraverser::visitLoop(glslang::TVisit /* visit */, glslang::TIntermLoop* node)
{
    auto blocks = builder.makeNewLoop();
    builder.createBranch(true, &blocks.head);

    // Loop control:
    std::vector<unsigned int> operands;
    const spv::LoopControlMask control = TranslateLoopControl(*node, operands);

    // Spec requires back edges to target header blocks, and every header block
    // must dominate its merge block.  Make a header block first to ensure these
    // conditions are met.  By definition, it will contain OpLoopMerge, followed
    // by a block-ending branch.  But we don't want to put any other body/test
    // instructions in it, since the body/test may have arbitrary instructions,
    // including merges of its own.
    builder.setBuildPoint(&blocks.head);
    builder.setDebugSourceLocation(node->getLoc().line, node->getLoc().getFilename());
    builder.createLoopMerge(&blocks.merge, &blocks.continue_target, control, operands);
    if (node->testFirst() && node->getTest()) {
        spv::Block& test = builder.makeNewBlock();
        builder.createBranch(true, &test);

        builder.setBuildPoint(&test);
        node->getTest()->traverse(this);
        spv::Id condition = accessChainLoad(node->getTest()->getType());
        builder.createConditionalBranch(condition, &blocks.body, &blocks.merge);

        builder.setBuildPoint(&blocks.body);
        breakForLoop.push(true);
        if (node->getBody())
            node->getBody()->traverse(this);
        builder.createBranch(true, &blocks.continue_target);
        breakForLoop.pop();

        builder.setBuildPoint(&blocks.continue_target);
        if (node->getTerminal())
            node->getTerminal()->traverse(this);
        builder.createBranch(true, &blocks.head);
    } else {
        builder.setDebugSourceLocation(node->getLoc().line, node->getLoc().getFilename());
        builder.createBranch(true, &blocks.body);

        breakForLoop.push(true);
        builder.setBuildPoint(&blocks.body);
        if (node->getBody())
            node->getBody()->traverse(this);
        builder.createBranch(true, &blocks.continue_target);
        breakForLoop.pop();

        builder.setBuildPoint(&blocks.continue_target);
        if (node->getTerminal())
            node->getTerminal()->traverse(this);
        if (node->getTest()) {
            node->getTest()->traverse(this);
            spv::Id condition =
                accessChainLoad(node->getTest()->getType());
            builder.createConditionalBranch(condition, &blocks.head, &blocks.merge);
        } else {
            // TODO: unless there was a break/return/discard instruction
            // somewhere in the body, this is an infinite loop, so we should
            // issue a warning.
            builder.createBranch(true, &blocks.head);
        }
    }
    builder.setBuildPoint(&blocks.merge);
    builder.closeLoop();
    return false;
}